

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O3

void __thiscall
jaegertracing::thrift::AggregationValidatorProcessor::process_validateTrace
          (AggregationValidatorProcessor *this,int32_t seqid,TProtocol *iprot,TProtocol *oprot,
          void *callContext)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  int iVar5;
  ulong __n;
  TProtocol *extraout_RDX;
  TProtocol *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_00;
  undefined1 auVar6 [16];
  TApplicationException x;
  AggregationValidator_validateTrace_result result;
  AggregationValidator_validateTrace_args args;
  element_type *local_e8;
  undefined8 uStack_e0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [32];
  undefined1 local_80 [8];
  undefined **local_78;
  bool local_70;
  int64_t local_68;
  _AggregationValidator_validateTrace_result__isset local_60;
  AggregationValidator_validateTrace_args local_58;
  
  __n = (ulong)(uint)seqid;
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_e8 = (element_type *)0x0;
    uStack_e0 = 0;
    __buf = iprot;
  }
  else {
    auVar6 = (**(code **)(*(long *)peVar1 + 0x10))
                       (peVar1,"AggregationValidator.validateTrace",callContext);
    uStack_e0 = auVar6._0_8_;
    local_e8 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
               super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    __buf = auVar6._8_8_;
    if (local_e8 != (element_type *)0x0) {
      (**(code **)(*(long *)local_e8 + 0x20))
                (local_e8,uStack_e0,"AggregationValidator.validateTrace");
      __buf = extraout_RDX;
    }
  }
  local_58.traceId._M_dataplus._M_p = (pointer)&local_58.traceId.field_2;
  local_58._vptr_AggregationValidator_validateTrace_args =
       (_func_int **)&PTR__AggregationValidator_validateTrace_args_00266928;
  local_58.traceId._M_string_length = 0;
  local_58.traceId.field_2._M_local_buf[0] = '\0';
  AggregationValidator_validateTrace_args::read
            (&local_58,(int)iprot,__buf,(size_t)local_58.traceId._M_dataplus._M_p);
  (*iprot->_vptr_TProtocol[0x18])(iprot);
  peVar2 = (iprot->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (iprot->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  iVar5 = (*peVar2->_vptr_TTransport[8])();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x28))
              (peVar1,uStack_e0,"AggregationValidator.validateTrace",iVar5);
  }
  local_80 = (undefined1  [8])&PTR__AggregationValidator_validateTrace_result_00266948;
  local_78 = &PTR__ValidateTraceResponse_00267e58;
  local_70 = false;
  local_68 = 0;
  local_60 = (_AggregationValidator_validateTrace_result__isset)((byte)local_60 & 0xfe);
  peVar4 = (this->iface_).
           super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (**(code **)(*(long *)peVar4 + 0x10))(peVar4,&local_78,&local_58.traceId);
  local_60 = (_AggregationValidator_validateTrace_result__isset)((byte)local_60 | 1);
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x30))(peVar1,uStack_e0,"AggregationValidator.validateTrace");
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"validateTrace","");
  (*oprot->_vptr_TProtocol[2])(oprot,local_b0,2);
  __buf_00 = extraout_RDX_00;
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
    __buf_00 = extraout_RDX_01;
  }
  AggregationValidator_validateTrace_result::write
            ((AggregationValidator_validateTrace_result *)local_80,(int)oprot,__buf_00,__n);
  (*oprot->_vptr_TProtocol[3])(oprot);
  peVar2 = (oprot->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (oprot->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  iVar5 = (*peVar2->_vptr_TTransport[10])();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar2 = (oprot->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (oprot->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_TTransport[0xb])();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x38))
              (peVar1,uStack_e0,"AggregationValidator.validateTrace",iVar5);
  }
  AggregationValidator_validateTrace_result::~AggregationValidator_validateTrace_result
            ((AggregationValidator_validateTrace_result *)local_80);
  AggregationValidator_validateTrace_args::~AggregationValidator_validateTrace_args(&local_58);
  if (local_e8 != (element_type *)0x0) {
    (**(code **)(*(long *)local_e8 + 0x18))(local_e8,uStack_e0,"AggregationValidator.validateTrace")
    ;
  }
  return;
}

Assistant:

void AggregationValidatorProcessor::process_validateTrace(int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol* oprot, void* callContext)
{
  void* ctx = NULL;
  if (this->eventHandler_.get() != NULL) {
    ctx = this->eventHandler_->getContext("AggregationValidator.validateTrace", callContext);
  }
  ::apache::thrift::TProcessorContextFreer freer(this->eventHandler_.get(), ctx, "AggregationValidator.validateTrace");

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->preRead(ctx, "AggregationValidator.validateTrace");
  }

  AggregationValidator_validateTrace_args args;
  args.read(iprot);
  iprot->readMessageEnd();
  uint32_t bytes = iprot->getTransport()->readEnd();

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->postRead(ctx, "AggregationValidator.validateTrace", bytes);
  }

  AggregationValidator_validateTrace_result result;
  try {
    iface_->validateTrace(result.success, args.traceId);
    result.__isset.success = true;
  } catch (const std::exception& e) {
    if (this->eventHandler_.get() != NULL) {
      this->eventHandler_->handlerError(ctx, "AggregationValidator.validateTrace");
    }

    ::apache::thrift::TApplicationException x(e.what());
    oprot->writeMessageBegin("validateTrace", ::apache::thrift::protocol::T_EXCEPTION, seqid);
    x.write(oprot);
    oprot->writeMessageEnd();
    oprot->getTransport()->writeEnd();
    oprot->getTransport()->flush();
    return;
  }

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->preWrite(ctx, "AggregationValidator.validateTrace");
  }

  oprot->writeMessageBegin("validateTrace", ::apache::thrift::protocol::T_REPLY, seqid);
  result.write(oprot);
  oprot->writeMessageEnd();
  bytes = oprot->getTransport()->writeEnd();
  oprot->getTransport()->flush();

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->postWrite(ctx, "AggregationValidator.validateTrace", bytes);
  }
}